

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::AssertionRemoval::visit(AssertionRemoval *this,Generator *gen)

{
  bool bVar1;
  StatementType SVar2;
  element_type *this_00;
  reference stmt_00;
  shared_ptr<kratos::Stmt> *stmt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range2;
  undefined1 local_50 [8];
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  uint64_t stmt_count;
  Generator *gen_local;
  AssertionRemoval *this_local;
  
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Generator::stmts_count(gen);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &i);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      stmts_to_remove.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)local_50,(uint32_t)gen);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
    SVar2 = Stmt::type(this_00);
    if (SVar2 == Assert) {
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>&>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)&i,(shared_ptr<kratos::Stmt> *)local_50);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_50);
  }
  __end2 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&i);
  stmt_1 = (shared_ptr<kratos::Stmt> *)
           std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           end((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)&i);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt_1);
    if (!bVar1) break;
    stmt_00 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
              ::operator*(&__end2);
    Generator::remove_stmt(gen,stmt_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &i);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmt_count = gen->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Assert) stmts_to_remove.emplace_back(stmt);
        }
        for (auto const &stmt : stmts_to_remove) {
            gen->remove_stmt(stmt);
        }
    }